

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Base::~Base(Base *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Base_00178778;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  return;
}

Assistant:

virtual ~Base() {}